

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

int __thiscall
cppqc::Generator<std::tuple<int>_>::GenModel<cppqc::detail::TupleGenerator<int>_>::clone
          (GenModel<cppqc::detail::TupleGenerator<int>_> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  void *pvVar1;
  TupleGenerator<int> *in_stack_ffffffffffffffc8;
  TupleGenerator<int> *in_stack_ffffffffffffffe8;
  GenModel<cppqc::detail::TupleGenerator<int>_> *in_stack_fffffffffffffff0;
  
  pvVar1 = operator_new(0x10);
  detail::TupleGenerator<int>::TupleGenerator((TupleGenerator<int> *)this,in_stack_ffffffffffffffc8)
  ;
  GenModel(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  detail::TupleGenerator<int>::~TupleGenerator((TupleGenerator<int> *)0x43077c);
  return (int)pvVar1;
}

Assistant:

detail::GenConcept<T>* clone() const override {
      return new GenModel(m_obj);
    }